

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O3

Gia_Man_t * Lf_ManDeriveMappingGia(Lf_Man_t *p)

{
  int iVar1;
  Jf_Par_t *pJVar2;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  undefined8 uVar5;
  Vec_Mem_t *pVVar6;
  word wVar7;
  byte bVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  uint uVar12;
  undefined4 *__s;
  Vec_Int_t *p_00;
  int *piVar13;
  Vec_Int_t *p_01;
  int *__s_00;
  Vec_Int_t *vMemory;
  Vec_Int_t *p_02;
  Gia_Man_t *p_03;
  size_t sVar14;
  char *pcVar15;
  Gia_Obj_t *pGVar16;
  Lf_Cut_t *pLVar17;
  undefined4 extraout_var;
  ulong uVar18;
  ulong *puVar19;
  uint uVar20;
  ulong uVar21;
  word *pwVar22;
  int Fill;
  int Fill_00;
  int Fill_01;
  int Fill_02;
  int iVar23;
  uint uVar24;
  uint uVar25;
  ulong uVar26;
  ulong uVar27;
  word *pwVar28;
  uint *puVar29;
  ulong uVar30;
  Gia_Man_t *pGVar31;
  ulong uVar32;
  int iVar33;
  word *pLimit;
  long lVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  int pVarsNew [12];
  word pTruthCof [64];
  uint local_2b8;
  uint local_2b4;
  undefined8 local_2b0;
  ulong local_2a8;
  word *local_2a0;
  ulong *local_298;
  ulong *local_290;
  long local_288;
  ulong local_280;
  ulong local_278;
  long local_270;
  int local_268 [12];
  word local_238 [65];
  
  uVar25 = p->pGia->nObjs;
  uVar30 = (ulong)(int)uVar25;
  uVar12 = uVar25;
  if (uVar25 - 1 < 0xf) {
    uVar12 = 0x10;
  }
  if (uVar12 == 0) {
    __s = (undefined4 *)0x0;
  }
  else {
    __s = (undefined4 *)malloc((long)(int)uVar12 << 2);
  }
  memset(__s,0xff,uVar30 * 4);
  pJVar2 = p->pPars;
  iVar33 = ((int)pJVar2->Area + uVar25) * 2 + (int)pJVar2->Edge;
  iVar1 = (int)pJVar2->Mux7;
  iVar11 = iVar33 + iVar1 * 4;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar23 = 0x10;
  if (0xe < (iVar33 + iVar1 * 4) - 1U) {
    iVar23 = iVar11;
  }
  p_00->nCap = iVar23;
  if (iVar23 == 0) {
    piVar13 = (int *)0x0;
  }
  else {
    piVar13 = (int *)malloc((long)iVar23 << 2);
  }
  p_00->pArray = piVar13;
  p_00->nSize = iVar11;
  __s_00 = (int *)0x0;
  memset(piVar13,0,(long)iVar11 << 2);
  iVar11 = (int)pJVar2->Area;
  iVar1 = (int)pJVar2->Edge;
  iVar33 = iVar1 + iVar11 * 2 + 1000;
  p_01 = (Vec_Int_t *)malloc(0x10);
  iVar23 = 0x10;
  if (0xe < iVar1 + iVar11 * 2 + 999U) {
    iVar23 = iVar33;
  }
  p_01->nCap = iVar23;
  if (iVar23 != 0) {
    __s_00 = (int *)malloc((long)iVar23 << 2);
  }
  p_01->pArray = __s_00;
  p_01->nSize = iVar33;
  memset(__s_00,0,(long)iVar33 << 2);
  vMemory = (Vec_Int_t *)malloc(0x10);
  vMemory->nCap = 0x10000;
  vMemory->nSize = 0;
  piVar13 = (int *)malloc(0x40000);
  vMemory->pArray = piVar13;
  p_02 = (Vec_Int_t *)malloc(0x10);
  p_02->nCap = 0x10;
  p_02->nSize = 0;
  piVar13 = (int *)malloc(0x40);
  p_02->pArray = piVar13;
  if (pJVar2->fCutMin == 0) {
    __assert_fail("p->pPars->fCutMin",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                  ,0x71c,"Gia_Man_t *Lf_ManDeriveMappingGia(Lf_Man_t *)");
  }
  p_03 = Gia_ManStart(uVar25);
  pGVar31 = p->pGia;
  pcVar3 = pGVar31->pName;
  if (pcVar3 == (char *)0x0) {
    pcVar15 = (char *)0x0;
  }
  else {
    sVar14 = strlen(pcVar3);
    pcVar15 = (char *)malloc(sVar14 + 1);
    strcpy(pcVar15,pcVar3);
  }
  p_03->pName = pcVar15;
  pcVar3 = pGVar31->pSpec;
  if (pcVar3 == (char *)0x0) {
    pcVar15 = (char *)0x0;
  }
  else {
    sVar14 = strlen(pcVar3);
    pcVar15 = (char *)malloc(sVar14 + 1);
    strcpy(pcVar15,pcVar3);
  }
  p_03->pSpec = pcVar15;
  if ((int)uVar25 < 1) {
LAB_007190ff:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  *__s = 0;
  if (1 < pGVar31->nObjs) {
    uVar26 = 1;
    do {
      pGVar4 = pGVar31->pObjs;
      uVar5 = *(undefined8 *)(pGVar4 + uVar26);
      uVar12 = (uint)uVar5;
      if ((uVar12 & 0x9fffffff) == 0x9fffffff) {
        pGVar16 = Gia_ManAppendObj(p_03);
        uVar32 = *(ulong *)pGVar16;
        *(ulong *)pGVar16 = uVar32 | 0x9fffffff;
        *(ulong *)pGVar16 =
             uVar32 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_03->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar4 = p_03->pObjs;
        if ((pGVar16 < pGVar4) || (pGVar4 + p_03->nObjs <= pGVar16)) {
LAB_007190e0:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(p_03->vCis,(int)((ulong)((long)pGVar16 - (long)pGVar4) >> 2) * -0x55555555);
        pGVar4 = p_03->pObjs;
        if ((pGVar16 < pGVar4) || (pGVar4 + p_03->nObjs <= pGVar16)) goto LAB_007190e0;
        if ((long)uVar30 <= (long)uVar26) goto LAB_007190ff;
        __s[uVar26] = (int)((ulong)((long)pGVar16 - (long)pGVar4) >> 2) * 0x55555556;
      }
      else {
        uVar20 = uVar12 & 0x1fffffff;
        iVar11 = (int)uVar26;
        if ((~uVar12 & 0x1fffffff) == 0 || -1 < (int)uVar12) {
          if ((((int)uVar12 < 0) || (uVar20 == 0x1fffffff)) ||
             (uVar20 != ((uint)((ulong)uVar5 >> 0x20) & 0x1fffffff))) {
            if ((long)(p->vOffsets).nSize <= (long)uVar26) {
LAB_007190a2:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            iVar1 = (p->vOffsets).pArray[uVar26];
            if (((long)iVar1 < 0) || ((p->vMapRefs).nSize <= iVar1)) goto LAB_007190a2;
            if ((p->vMapRefs).pArray[iVar1] != 0) {
              pLVar17 = Lf_ObjCutBest(p,iVar11);
              uVar12 = pLVar17->iFunc;
              if ((int)uVar12 < 0) {
                __assert_fail("pCut->iFunc >= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                              ,0x739,"Gia_Man_t *Lf_ManDeriveMappingGia(Lf_Man_t *)");
              }
              uVar20 = *(uint *)&pLVar17->field_0x14;
              if (uVar20 < 0x1000000) {
                if (1 < uVar12) {
                  __assert_fail("Abc_Lit2Var(pCut->iFunc) == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                                ,0x73c,"Gia_Man_t *Lf_ManDeriveMappingGia(Lf_Man_t *)");
                }
                if (uVar30 <= uVar26) goto LAB_007190ff;
                __s[uVar26] = uVar12;
              }
              else {
                if ((uVar20 & 0xff000000) == 0x1000000) {
                  if ((uVar12 & 0x7ffffffe) != 2) {
                    __assert_fail("Abc_Lit2Var(pCut->iFunc) == 1",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                                  ,0x742,"Gia_Man_t *Lf_ManDeriveMappingGia(Lf_Man_t *)");
                  }
                  uVar20 = (uint)pLVar17[1].Sign;
                  if (uVar25 <= uVar20) goto LAB_007190a2;
                  if ((int)__s[uVar20] < 0) goto LAB_0071911e;
                  if (uVar30 <= uVar26) goto LAB_007190ff;
                  uVar12 = __s[uVar20] ^ uVar12 & 1;
                }
                else {
                  uVar24 = p->pPars->nLutSizeMux;
                  if ((uVar24 == 0) || (uVar24 != uVar20 >> 0x18)) {
                    p_02->nSize = 0;
                    uVar12 = *(uint *)&pLVar17->field_0x14;
                    if ((uVar12 >> 0x17 & 1) == 0) {
                      if (0xffffff < uVar12) {
                        uVar32 = 0;
                        do {
                          uVar12 = *(uint *)((long)&pLVar17[1].Sign + uVar32 * 4);
                          if (uVar25 <= uVar12) goto LAB_007190a2;
                          Vec_IntPush(p_02,__s[uVar12]);
                          uVar32 = uVar32 + 1;
                        } while (uVar32 < (byte)pLVar17->field_0x17);
                      }
                    }
                    else {
                      if ((uVar12 & 0xff000000) != 0x3000000) {
                        __assert_fail("pCut->nLeaves == 3",
                                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                                      ,0x6fd,
                                      "int Lf_ManDerivePart(Lf_Man_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Lf_Cut_t *, Vec_Int_t *, Vec_Int_t *, Gia_Obj_t *)"
                                     );
                      }
                      uVar12 = (uint)pLVar17[1].Sign;
                      if (uVar25 <= uVar12) goto LAB_007190a2;
                      if ((int)__s[uVar12] < 0) goto LAB_0071911e;
                      pGVar4 = pGVar4 + uVar26;
                      Vec_IntPush(p_02,*(uint *)pGVar4 >> 0x1d & 1 ^ __s[uVar12]);
                      uVar12 = *(uint *)((long)&pLVar17[1].Sign + 4);
                      if (((long)(int)uVar12 < 0) || (uVar25 <= uVar12)) goto LAB_007190a2;
                      if ((int)__s[(int)uVar12] < 0) goto LAB_0071911e;
                      Vec_IntPush(p_02,(uint)((ulong)*(undefined8 *)pGVar4 >> 0x3d) & 1 ^
                                       __s[(int)uVar12]);
                      uVar12 = pLVar17[1].Delay;
                      if (((long)(int)uVar12 < 0) || (uVar25 <= uVar12)) goto LAB_007190a2;
                      pGVar31 = p->pGia;
                      if (pGVar31->pMuxes == (uint *)0x0) {
                        uVar20 = 0;
                      }
                      else {
                        pGVar16 = pGVar31->pObjs;
                        if ((pGVar4 < pGVar16) || (pGVar16 + pGVar31->nObjs <= pGVar4))
                        goto LAB_007190e0;
                        uVar20 = pGVar31->pMuxes
                                 [(int)((ulong)((long)pGVar4 - (long)pGVar16) >> 2) * -0x55555555];
                        if ((int)uVar20 < 0) goto LAB_007191f7;
                        uVar20 = uVar20 & 1;
                      }
                      if ((int)__s[(int)uVar12] < 0) goto LAB_0071911e;
                      Vec_IntPush(p_02,uVar20 ^ __s[(int)uVar12]);
                    }
                    if (pLVar17->iFunc < 0) {
LAB_007190c1:
                      __assert_fail("Lit >= 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                                    ,0xf2,"int Abc_Lit2Var(int)");
                    }
                    pVVar6 = p->vTtMem;
                    uVar12 = (uint)pLVar17->iFunc >> 1;
                    if (pVVar6->nEntries <= (int)uVar12) goto LAB_00719216;
                    uVar12 = Kit_TruthToGia(p_03,(uint *)(pVVar6->ppPages
                                                          [uVar12 >> ((byte)pVVar6->LogPageSze &
                                                                     0x1f)] +
                                                         (ulong)(uVar12 & pVVar6->PageMask) *
                                                         (long)pVVar6->nEntrySize),p_02->nSize,
                                            vMemory,p_02,0);
                    if ((int)uVar12 < 0) goto LAB_007190c1;
                    uVar20 = uVar12 >> 1;
                    iVar11 = p_01->nSize;
                    Vec_IntFillExtra(p_00,uVar20 + 1,Fill_01);
                    if (p_00->nSize <= (int)uVar20) goto LAB_007190ff;
                    p_00->pArray[uVar20] = iVar11;
                    Vec_IntPush(p_01,p_02->nSize);
                    if (0 < p_02->nSize) {
                      lVar34 = 0;
                      do {
                        if (p_02->pArray[lVar34] < 0) goto LAB_007190c1;
                        Vec_IntPush(p_01,(uint)p_02->pArray[lVar34] >> 1);
                        lVar34 = lVar34 + 1;
                      } while (lVar34 < p_02->nSize);
                    }
                    uVar24 = -uVar20;
                    if ((*(uint *)&pLVar17->field_0x14 >> 0x17 & 1) == 0) {
                      uVar24 = uVar20;
                    }
                    Vec_IntPush(p_01,uVar24);
                  }
                  else {
                    pVVar6 = p->vTtMem;
                    uVar12 = uVar12 >> 1;
                    if (pVVar6->nEntries <= (int)uVar12) {
LAB_00719216:
                      __assert_fail("i >= 0 && i < p->nEntries",
                                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecMem.h"
                                    ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
                    }
                    pwVar22 = pVVar6->ppPages[uVar12 >> ((byte)pVVar6->LogPageSze & 0x1f)] +
                              (ulong)(uVar12 & pVVar6->PageMask) * (long)pVVar6->nEntrySize;
                    uVar12 = p->pPars->nLutSize;
                    local_278 = (ulong)uVar12;
                    uVar20 = 1 << ((char)uVar12 - 6U & 0x1f);
                    if ((int)uVar12 < 7) {
                      uVar20 = 1;
                    }
                    uVar12 = Lf_ManFindCofVar(pwVar22,uVar20,uVar24);
                    if (uVar24 <= uVar12) {
                      __assert_fail("iVar >= 0 && iVar < (int)pCut->nLeaves",
                                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                                    ,0x6d4,
                                    "int Lf_ManDerivePart(Lf_Man_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Lf_Cut_t *, Vec_Int_t *, Vec_Int_t *, Gia_Obj_t *)"
                                   );
                    }
                    iVar11 = uVar12 - 6;
                    uVar24 = 1 << ((byte)iVar11 & 0x1f);
                    local_298 = pwVar22 + (int)uVar20;
                    uVar32 = 1;
                    if (1 < (int)uVar24) {
                      uVar32 = (ulong)uVar24;
                    }
                    local_280 = (ulong)(uint)(1 << ((byte)uVar12 & 0x1f));
                    uVar18 = (ulong)uVar12;
                    local_288 = (long)(2 << ((byte)iVar11 & 0x1f)) << 3;
                    local_2a0 = local_238 + (int)uVar24;
                    local_270 = (long)(int)uVar24 << 3;
                    puVar29 = &local_2b4;
                    local_2b0 = CONCAT44(extraout_var,uVar12);
                    local_2a8 = (ulong)uVar20;
                    local_290 = pwVar22;
                    bVar10 = true;
                    do {
                      bVar9 = bVar10;
                      uVar12 = *(uint *)&pLVar17->field_0x14 >> 0x18;
                      if (0xffffff < *(uint *)&pLVar17->field_0x14) {
                        lVar34 = (ulong)uVar12 - 1;
                        auVar35._8_4_ = (int)lVar34;
                        auVar35._0_8_ = lVar34;
                        auVar35._12_4_ = (int)((ulong)lVar34 >> 0x20);
                        auVar35 = auVar35 ^ _DAT_008403e0;
                        uVar21 = 0;
                        auVar36 = _DAT_008403d0;
                        do {
                          auVar37 = auVar36 ^ _DAT_008403e0;
                          if ((bool)(~(auVar35._4_4_ < auVar37._4_4_ ||
                                      auVar35._0_4_ < auVar37._0_4_ &&
                                      auVar37._4_4_ == auVar35._4_4_) & 1)) {
                            local_268[uVar21] = (int)uVar21;
                          }
                          if (auVar37._12_4_ <= auVar35._12_4_ &&
                              (auVar37._8_4_ <= auVar35._8_4_ || auVar37._12_4_ != auVar35._12_4_))
                          {
                            local_268[uVar21 + 1] = (int)uVar21 + 1;
                          }
                          uVar21 = uVar21 + 2;
                          lVar34 = auVar36._8_8_;
                          auVar36._0_8_ = auVar36._0_8_ + 2;
                          auVar36._8_8_ = lVar34 + 2;
                        } while ((uVar12 + 1 & 0xfffffffe) != uVar21);
                      }
                      bVar8 = (byte)local_280;
                      if (bVar9) {
                        if (uVar20 == 1) {
                          uVar21 = s_Truths6Neg[uVar18] & *local_290;
                          local_238[0] = uVar21 << (bVar8 & 0x3f);
LAB_00718958:
                          local_238[0] = local_238[0] | uVar21;
                        }
                        else if ((uint)local_2b0 < 6) {
                          if (0 < (int)uVar20) {
                            uVar21 = s_Truths6Neg[uVar18];
                            uVar27 = 0;
                            do {
                              local_238[uVar27] =
                                   (local_290[uVar27] & uVar21) << (bVar8 & 0x3f) |
                                   local_290[uVar27] & uVar21;
                              uVar27 = uVar27 + 1;
                            } while (local_2a8 != uVar27);
                          }
                        }
                        else if (0 < (int)uVar20) {
                          pwVar22 = local_238;
                          puVar19 = local_290;
                          pwVar28 = local_2a0;
                          do {
                            if (iVar11 != 0x1f) {
                              uVar21 = 0;
                              do {
                                uVar27 = puVar19[uVar21];
                                pwVar22[uVar21] = uVar27;
                                pwVar28[uVar21] = uVar27;
                                uVar21 = uVar21 + 1;
                              } while (uVar32 != uVar21);
                            }
                            puVar19 = (ulong *)((long)puVar19 + local_288);
                            pwVar28 = (word *)((long)pwVar28 + local_288);
                            pwVar22 = (word *)((long)pwVar22 + local_288);
                          } while (puVar19 < local_298);
                        }
                      }
                      else {
                        if (uVar20 == 1) {
                          uVar21 = s_Truths6[uVar18] & *local_290;
                          local_238[0] = uVar21 >> (bVar8 & 0x3f);
                          goto LAB_00718958;
                        }
                        if ((uint)local_2b0 < 6) {
                          if (0 < (int)uVar20) {
                            uVar21 = s_Truths6[uVar18];
                            uVar27 = 0;
                            do {
                              local_238[uVar27] =
                                   (local_290[uVar27] & uVar21) >> (bVar8 & 0x3f) |
                                   local_290[uVar27] & uVar21;
                              uVar27 = uVar27 + 1;
                            } while (local_2a8 != uVar27);
                          }
                        }
                        else if (0 < (int)uVar20) {
                          pwVar22 = local_238;
                          puVar19 = local_290;
                          do {
                            if (iVar11 != 0x1f) {
                              uVar21 = 0;
                              do {
                                wVar7 = *(word *)((long)puVar19 + uVar21 * 8 + local_270);
                                pwVar22[uVar21] = wVar7;
                                *(word *)((long)pwVar22 + uVar21 * 8 + local_270) = wVar7;
                                uVar21 = uVar21 + 1;
                              } while (uVar32 != uVar21);
                            }
                            puVar19 = (ulong *)((long)puVar19 + local_288);
                            pwVar22 = (word *)((long)pwVar22 + local_288);
                          } while (puVar19 < local_298);
                        }
                      }
                      uVar12 = Abc_TtMinBase(local_238,local_268,uVar12,(int)local_278);
                      if ((int)uVar12 < 1) {
                        __assert_fail("nVarsNew > 0",
                                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                                      ,0x6de,
                                      "int Lf_ManDerivePart(Lf_Man_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Lf_Cut_t *, Vec_Int_t *, Vec_Int_t *, Gia_Obj_t *)"
                                     );
                      }
                      p_02->nSize = 0;
                      uVar21 = 0;
                      do {
                        uVar24 = *(uint *)((long)&pLVar17[1].Sign + (long)local_268[uVar21] * 4);
                        if (uVar25 <= uVar24) goto LAB_007190a2;
                        Vec_IntPush(p_02,__s[uVar24]);
                        uVar21 = uVar21 + 1;
                      } while (uVar12 != uVar21);
                      uVar12 = Kit_TruthToGia(p_03,(uint *)local_238,uVar12,vMemory,p_02,0);
                      *puVar29 = uVar12;
                      if ((int)uVar12 < 0) goto LAB_007190c1;
                      uVar12 = uVar12 >> 1;
                      iVar1 = p_01->nSize;
                      Vec_IntFillExtra(p_00,uVar12 + 1,Fill);
                      if (p_00->nSize <= (int)uVar12) goto LAB_007190ff;
                      p_00->pArray[uVar12] = iVar1;
                      Vec_IntPush(p_01,p_02->nSize);
                      if (0 < p_02->nSize) {
                        lVar34 = 0;
                        do {
                          if (p_02->pArray[lVar34] < 0) goto LAB_007190c1;
                          Vec_IntPush(p_01,(uint)p_02->pArray[lVar34] >> 1);
                          lVar34 = lVar34 + 1;
                        } while (lVar34 < p_02->nSize);
                      }
                      Vec_IntPush(p_01,uVar12);
                      puVar29 = &local_2b8;
                      bVar10 = false;
                    } while (bVar9);
                    local_238[0] = 0xcacacacacacacaca;
                    p_02->nSize = 0;
                    Vec_IntPush(p_02,local_2b4);
                    Vec_IntPush(p_02,local_2b8);
                    uVar12 = *(uint *)((long)&pLVar17[1].Sign + uVar18 * 4);
                    if (uVar25 <= uVar12) goto LAB_007190a2;
                    Vec_IntPush(p_02,__s[uVar12]);
                    uVar12 = Kit_TruthToGia(p_03,(uint *)local_238,p_02->nSize,vMemory,p_02,0);
                    if ((int)uVar12 < 0) goto LAB_007190c1;
                    uVar20 = uVar12 >> 1;
                    iVar11 = p_01->nSize;
                    Vec_IntFillExtra(p_00,uVar20 + 1,Fill_00);
                    if (p_00->nSize <= (int)uVar20) goto LAB_007190ff;
                    p_00->pArray[uVar20] = iVar11;
                    Vec_IntPush(p_01,p_02->nSize);
                    if (0 < p_02->nSize) {
                      lVar34 = 0;
                      do {
                        if (p_02->pArray[lVar34] < 0) goto LAB_007190c1;
                        Vec_IntPush(p_01,(uint)p_02->pArray[lVar34] >> 1);
                        lVar34 = lVar34 + 1;
                      } while (lVar34 < p_02->nSize);
                    }
                    Vec_IntPush(p_01,-uVar20);
                  }
                  if (pLVar17->iFunc < 0) {
LAB_007191f7:
                    __assert_fail("Lit >= 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                                  ,0xf3,"int Abc_LitIsCompl(int)");
                  }
                  if ((int)uVar12 < 0) {
LAB_0071911e:
                    __assert_fail("Lit >= 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                                  ,0xf5,"int Abc_LitNotCond(int, int)");
                  }
                  if (uVar30 <= uVar26) goto LAB_007190ff;
                  uVar12 = pLVar17->iFunc & 1U ^ uVar12;
                }
                __s[uVar26] = uVar12;
              }
            }
          }
          else {
            if (uVar25 <= iVar11 - uVar20) goto LAB_007190a2;
            if ((int)__s[iVar11 - uVar20] < 0) goto LAB_0071911e;
            iVar11 = Gia_ManAppendBuf(p_03,__s[iVar11 - uVar20] ^ uVar12 >> 0x1d & 1);
            if (uVar30 <= uVar26) goto LAB_007190ff;
            __s[uVar26] = iVar11;
          }
        }
        else {
          if (uVar25 <= iVar11 - uVar20) goto LAB_007190a2;
          if ((int)__s[iVar11 - uVar20] < 0) goto LAB_0071911e;
          Gia_ManAppendCo(p_03,__s[iVar11 - uVar20] ^ uVar12 >> 0x1d & 1);
        }
      }
      uVar26 = uVar26 + 1;
      pGVar31 = p->pGia;
    } while ((long)uVar26 < (long)pGVar31->nObjs);
  }
  free(__s);
  if (vMemory->pArray != (int *)0x0) {
    free(vMemory->pArray);
  }
  free(vMemory);
  if (p_02->pArray != (int *)0x0) {
    free(p_02->pArray);
  }
  free(p_02);
  uVar25 = p_03->nObjs;
  if ((int)uVar25 < p_00->nSize) {
    p_00->nSize = uVar25;
  }
  else {
    Vec_IntFillExtra(p_00,uVar25,Fill_02);
    uVar25 = p_03->nObjs;
    if (p_00->nSize != uVar25) {
      __assert_fail("Vec_IntSize(vMapping) == Gia_ManObjNum(pNew)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                    ,0x752,"Gia_Man_t *Lf_ManDeriveMappingGia(Lf_Man_t *)");
    }
  }
  if (0 < (int)uVar25) {
    piVar13 = p_00->pArray;
    uVar30 = 0;
    do {
      iVar11 = piVar13[uVar30];
      if (0 < iVar11) {
        piVar13[uVar30] = iVar11 + p_03->nObjs;
      }
      uVar30 = uVar30 + 1;
    } while (uVar30 < uVar25);
  }
  iVar11 = p_01->nSize;
  piVar13 = p_01->pArray;
  if ((long)iVar11 < 1) {
    if (piVar13 == (int *)0x0) goto LAB_00719058;
  }
  else {
    lVar34 = 0;
    do {
      Vec_IntPush(p_00,piVar13[lVar34]);
      lVar34 = lVar34 + 1;
    } while (iVar11 != lVar34);
  }
  free(piVar13);
LAB_00719058:
  free(p_01);
  if (p_03->vMapping != (Vec_Int_t *)0x0) {
    __assert_fail("pNew->vMapping == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                  ,0x759,"Gia_Man_t *Lf_ManDeriveMappingGia(Lf_Man_t *)");
  }
  p_03->vMapping = p_00;
  Gia_ManSetRegNum(p_03,p->pGia->nRegs);
  return p_03;
}

Assistant:

Gia_Man_t * Lf_ManDeriveMappingGia( Lf_Man_t * p )
{
    Gia_Man_t * pNew; 
    Gia_Obj_t * pObj; 
    Vec_Int_t * vCopies   = Vec_IntStartFull( Gia_ManObjNum(p->pGia) );
    Vec_Int_t * vMapping  = Vec_IntStart( 2*Gia_ManObjNum(p->pGia) + (int)p->pPars->Edge + 2*(int)p->pPars->Area + 4*(int)p->pPars->Mux7 );
    Vec_Int_t * vMapping2 = Vec_IntStart( (int)p->pPars->Edge + 2*(int)p->pPars->Area + 1000 );
    Vec_Int_t * vCover    = Vec_IntAlloc( 1 << 16 );
    Vec_Int_t * vLeaves   = Vec_IntAlloc( 16 );
    Lf_Cut_t * pCut;
    int i, iLit; 
    assert( p->pPars->fCutMin );
    // create new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p->pGia) );
    pNew->pName = Abc_UtilStrsav( p->pGia->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pGia->pSpec );
    Vec_IntWriteEntry( vCopies, 0, 0 );
    Gia_ManForEachObj1( p->pGia, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
        {
            Vec_IntWriteEntry( vCopies, i, Gia_ManAppendCi(pNew) );
            continue;
        }
        if ( Gia_ObjIsCo(pObj) )
        {
            iLit = Vec_IntEntry( vCopies, Gia_ObjFaninId0p(p->pGia, pObj) );
            iLit = Gia_ManAppendCo( pNew, Abc_LitNotCond(iLit, Gia_ObjFaninC0(pObj)) );
            continue;
        }
        if ( Gia_ObjIsBuf(pObj) )
        {
            iLit = Vec_IntEntry( vCopies, Gia_ObjFaninId0p(p->pGia, pObj) );
            iLit = Gia_ManAppendBuf( pNew, Abc_LitNotCond(iLit, Gia_ObjFaninC0(pObj)) );
            Vec_IntWriteEntry( vCopies, i, iLit );
            continue;
        }
        if ( !Lf_ObjMapRefNum(p, i) )
            continue;
        pCut = Lf_ObjCutBest( p, i );
        assert( pCut->iFunc >= 0 );
        if ( pCut->nLeaves == 0 )
        {
            assert( Abc_Lit2Var(pCut->iFunc) == 0 );
            Vec_IntWriteEntry( vCopies, i, pCut->iFunc );
            continue;
        }
        if ( pCut->nLeaves == 1 )
        {
            assert( Abc_Lit2Var(pCut->iFunc) == 1 );
            iLit = Vec_IntEntry( vCopies, pCut->pLeaves[0] );
            Vec_IntWriteEntry( vCopies, i, Abc_LitNotCond(iLit, Abc_LitIsCompl(pCut->iFunc)) );
            continue;
        }
        iLit = Lf_ManDerivePart( p, pNew, vMapping, vMapping2, vCopies, pCut, vLeaves, vCover, pObj );
        Vec_IntWriteEntry( vCopies, i, Abc_LitNotCond(iLit, Abc_LitIsCompl(pCut->iFunc)) );
    }
    Vec_IntFree( vCopies );
    Vec_IntFree( vCover );
    Vec_IntFree( vLeaves );
    // finish mapping 
    if ( Vec_IntSize(vMapping) > Gia_ManObjNum(pNew) )
        Vec_IntShrink( vMapping, Gia_ManObjNum(pNew) );
    else
        Vec_IntFillExtra( vMapping, Gia_ManObjNum(pNew), 0 );
    assert( Vec_IntSize(vMapping) == Gia_ManObjNum(pNew) );
    Vec_IntForEachEntry( vMapping, iLit, i )
        if ( iLit > 0 )
            Vec_IntAddToEntry( vMapping, i, Gia_ManObjNum(pNew) );
    Vec_IntAppend( vMapping, vMapping2 );
    Vec_IntFree( vMapping2 );
    // attach mapping and packing
    assert( pNew->vMapping == NULL );
    pNew->vMapping = vMapping;
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p->pGia) );
    return pNew;
}